

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O1

void dg::DOD::constructBinaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  pointer ppCVar1;
  bool bVar2;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var3;
  CDNode *gcur;
  CDNode *local_58;
  ColoringT *local_50;
  ColoredAp *local_48;
  ResultT *local_40;
  CDNode *local_38;
  
  local_50 = &CAp->reds;
  local_48 = CAp;
  local_40 = revCD;
  local_38 = p;
  do {
    local_58 = ColoredAp::getGNode(local_48,b2);
    p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](CD,&local_58);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_38);
    p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_40,&local_38);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_58);
    ppCVar1 = (b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      b2 = ppCVar1[-1];
    }
    else {
      b2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->blues,(ulong)b2->_id);
  } while ((!bVar2) &&
          (bVar2 = ADT::
                   SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                   ::get(local_50,(ulong)b2->_id), !bVar2));
  while( true ) {
    local_58 = ColoredAp::getGNode(local_48,r2);
    p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](CD,&local_58);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_38);
    p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
              *)std::
                map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::operator[](local_40,&local_38);
    std::
    _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
    ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_58);
    ppCVar1 = (r2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(r2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      r2 = ppCVar1[-1];
    }
    else {
      r2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->blues,(ulong)r2->_id);
    if (bVar2) break;
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(local_50,(ulong)r2->_id);
    if (bVar2) {
      return;
    }
  }
  return;
}

Assistant:

static void constructBinaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                        ResultT &revCD, CDNode *b2, CDNode *b3,
                                        CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;

        cur = r2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == b3);
        (void) b3;
    }